

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecMult.c
# Opt level: O2

void Acec_MultFindPPs_rec(Gia_Man_t *p,int iObj,Vec_Int_t *vBold)

{
  uint uVar1;
  Gia_Obj_t *pGVar2;
  
  pGVar2 = Gia_ManObj(p,iObj);
  uVar1 = (uint)*(ulong *)pGVar2;
  if (((uVar1 >> 0x1e & 1) == 0) &&
     (*(ulong *)pGVar2 = *(ulong *)pGVar2 | 0x40000000,
     -1 < (int)uVar1 && (~uVar1 & 0x1fffffff) != 0)) {
    Acec_MultFindPPs_rec(p,iObj - (uVar1 & 0x1fffffff),vBold);
    Acec_MultFindPPs_rec(p,iObj - (*(uint *)&pGVar2->field_0x4 & 0x1fffffff),vBold);
    Vec_IntPush(vBold,iObj);
    return;
  }
  return;
}

Assistant:

void Acec_MultFindPPs_rec( Gia_Man_t * p, int iObj, Vec_Int_t * vBold )
{
    Gia_Obj_t * pObj;
    pObj = Gia_ManObj( p, iObj );
    if ( pObj->fMark0 )
        return;
    pObj->fMark0 = 1;
    if ( !Gia_ObjIsAnd(pObj) )
        return;
    Acec_MultFindPPs_rec( p, Gia_ObjFaninId0(pObj, iObj), vBold );
    Acec_MultFindPPs_rec( p, Gia_ObjFaninId1(pObj, iObj), vBold );
    Vec_IntPush( vBold, iObj );
}